

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O2

void __thiscall
cmDocumentationFormatter::PrintSection
          (cmDocumentationFormatter *this,ostream *os,cmDocumentationSection *section)

{
  size_t sVar1;
  pointer pcVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  ostream *poVar5;
  ulong uVar6;
  cmDocumentationEntry *entry;
  pointer pcVar7;
  string local_50 [32];
  
  sVar1 = this->TextIndent;
  std::__cxx11::string::string(local_50,(string *)section);
  poVar5 = std::operator<<(os,local_50);
  std::operator<<(poVar5,'\n');
  std::__cxx11::string::~string(local_50);
  pcVar2 = (section->Entries).
           super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar7 = (section->Entries).
                super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                _M_impl.super__Vector_impl_data._M_start; pcVar7 != pcVar2; pcVar7 = pcVar7 + 1) {
    if ((pcVar7->Name)._M_string_length == 0) {
      std::operator<<(os,'\n');
      this->TextIndent = 0;
      PrintFormatted(this,os,&pcVar7->Brief);
    }
    else {
      this->TextIndent = 0x21;
      pp_Var3 = os->_vptr_basic_ostream;
      *(undefined8 *)(&os->field_0x10 + (long)pp_Var3[-3]) = 2;
      p_Var4 = pp_Var3[-3];
      *(uint *)(&os->field_0x18 + (long)p_Var4) =
           *(uint *)(&os->field_0x18 + (long)p_Var4) & 0xffffff4f | 0x20;
      poVar5 = std::operator<<(os,pcVar7->CustomNamePrefix);
      uVar6 = (pcVar7->Name)._M_string_length;
      if (uVar6 < 0x1e) {
        uVar6 = 0x1d;
      }
      *(long *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = (long)(int)uVar6;
      std::operator<<(poVar5,(string *)pcVar7);
      if (0x1d < (pcVar7->Name)._M_string_length) {
        poVar5 = std::operator<<(os,'\n');
        *(long *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) =
             (long)((int)this->TextIndent + -2);
        std::operator<<(poVar5,' ');
      }
      std::operator<<(os,"= ");
      PrintColumn(this,os,&pcVar7->Brief);
      std::operator<<(os,'\n');
    }
  }
  std::operator<<(os,'\n');
  this->TextIndent = sVar1;
  return;
}

Assistant:

void cmDocumentationFormatter::PrintSection(
  std::ostream& os, cmDocumentationSection const& section)
{
  const std::size_t PREFIX_SIZE =
    sizeof(cmDocumentationEntry::CustomNamePrefix) + 1u;
  // length of the "= " literal (see below)
  const std::size_t SUFFIX_SIZE = 2u;
  // legacy magic number ;-)
  const std::size_t NAME_SIZE = 29u;

  const std::size_t PADDING_SIZE = PREFIX_SIZE + SUFFIX_SIZE;
  const std::size_t TITLE_SIZE = NAME_SIZE + PADDING_SIZE;

  const auto savedIndent = this->TextIndent;

  os << section.GetName() << '\n';

  for (cmDocumentationEntry const& entry : section.GetEntries()) {
    if (!entry.Name.empty()) {
      this->TextIndent = TITLE_SIZE;
      os << std::setw(PREFIX_SIZE) << std::left << entry.CustomNamePrefix
         << std::setw(int(std::max(NAME_SIZE, entry.Name.size())))
         << entry.Name;
      if (entry.Name.size() > NAME_SIZE) {
        os << '\n' << std::setw(int(this->TextIndent - PREFIX_SIZE)) << ' ';
      }
      os << "= ";
      this->PrintColumn(os, entry.Brief);
      os << '\n';
    } else {
      os << '\n';
      this->TextIndent = 0u;
      this->PrintFormatted(os, entry.Brief);
    }
  }

  os << '\n';

  this->TextIndent = savedIndent;
}